

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Balance(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_50;
  uint local_4c;
  int fVeryVerbose;
  int fVerbose;
  int c;
  int fKeepLevel;
  int fStrict;
  int fSimpleAnd;
  int fDelayOnly;
  int nNewNodesMax;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fSimpleAnd = 1000000000;
  bVar1 = false;
  fKeepLevel = 0;
  c = 0;
  local_4c = 0;
  local_50 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Ndaslvwh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Balance(): There is no AIG.\n");
        return 1;
      }
      if (bVar1) {
        _fDelayOnly = Gia_ManBalance(pAbc->pGia,fKeepLevel,c,local_4c);
      }
      else {
        _fDelayOnly = Gia_ManAreaBalance(pAbc->pGia,fKeepLevel,fSimpleAnd,local_4c,local_50);
      }
      Abc_FrameUpdateGia(pAbc,_fDelayOnly);
      return 0;
    }
    switch(iVar2) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by a char string.\n");
        goto LAB_002a6b4a;
      }
      fSimpleAnd = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fSimpleAnd < 0) {
LAB_002a6b4a:
        Abc_Print(-2,"usage: &b [-N num] [-dasvwh]\n");
        Abc_Print(-2,"\t         performs AIG balancing to reduce delay and area\n");
        Abc_Print(-2,"\t-N num : the max fanout count to skip a divisor [default = %d]\n",
                  (ulong)(uint)fSimpleAnd);
        pcVar3 = "no";
        if (bVar1) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-d     : toggle delay only balancing [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (fKeepLevel != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggle using AND instead of AND/XOR/MUX [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (c != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,
                  "\t-s     : toggle strict control of area in delay-mode (\"&b -d\") [default = %s]\n"
                  ,pcVar3);
        pcVar3 = "no";
        if (local_4c != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (local_50 != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-w     : toggle printing additional information [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_002a6b4a;
    case 0x61:
      fKeepLevel = fKeepLevel ^ 1;
      break;
    case 100:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x68:
      goto LAB_002a6b4a;
    case 0x6c:
      break;
    case 0x73:
      c = c ^ 1;
      break;
    case 0x76:
      local_4c = local_4c ^ 1;
      break;
    case 0x77:
      local_50 = local_50 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Balance( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp = NULL;
    int nNewNodesMax = ABC_INFINITY;
    int fDelayOnly   = 0;
    int fSimpleAnd   = 0;
    int fStrict      = 0;
    int fKeepLevel   = 0;
    int c, fVerbose  = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ndaslvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a char string.\n" );
                goto usage;
            }
            nNewNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNewNodesMax < 0 )
                goto usage;
            break;
        case 'd':
            fDelayOnly ^= 1;
            break;
        case 'a':
            fSimpleAnd ^= 1;
            break;
        case 's':
            fStrict ^= 1;
            break;
        case 'l':
            fKeepLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Balance(): There is no AIG.\n" );
        return 1;
    }
    if ( fDelayOnly )
        pTemp = Gia_ManBalance( pAbc->pGia, fSimpleAnd, fStrict, fVerbose );
    else
        pTemp = Gia_ManAreaBalance( pAbc->pGia, fSimpleAnd, nNewNodesMax, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &b [-N num] [-dasvwh]\n" );
    Abc_Print( -2, "\t         performs AIG balancing to reduce delay and area\n" );
    Abc_Print( -2, "\t-N num : the max fanout count to skip a divisor [default = %d]\n", nNewNodesMax );
    Abc_Print( -2, "\t-d     : toggle delay only balancing [default = %s]\n", fDelayOnly? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using AND instead of AND/XOR/MUX [default = %s]\n", fSimpleAnd? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle strict control of area in delay-mode (\"&b -d\") [default = %s]\n", fStrict? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}